

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O2

base_uint<256U> * __thiscall base_uint<256U>::operator>>=(base_uint<256U> *this,uint shift)

{
  long lVar1;
  uint *puVar2;
  long lVar3;
  sbyte sVar4;
  int i;
  long lVar5;
  uint uVar6;
  uint32_t uVar7;
  long in_FS_OFFSET;
  base_uint<256U> a;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint(&a,this);
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    this->pn[lVar5] = 0;
  }
  sVar4 = (sbyte)(shift & 0x1f);
  uVar6 = (shift >> 5) << 2;
  lVar5 = 0;
  do {
    if (lVar5 == 8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
        return this;
      }
      __stack_chk_fail();
    }
    lVar1 = lVar5 - (ulong)(shift >> 5);
    if (lVar1 < 1 || (shift & 0x1f) == 0) {
      if (-1 < lVar1) {
        uVar7 = a.pn[lVar5];
        goto LAB_00152181;
      }
    }
    else {
      uVar7 = a.pn[lVar5];
      puVar2 = (uint *)((long)this + lVar5 * 4 + (-4 - (ulong)uVar6));
      *puVar2 = *puVar2 | uVar7 << (0x20U - sVar4 & 0x1f);
LAB_00152181:
      puVar2 = (uint *)((long)this + (lVar5 * 4 - (ulong)uVar6));
      *puVar2 = *puVar2 | uVar7 >> sVar4;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

base_uint<BITS>& base_uint<BITS>::operator>>=(unsigned int shift)
{
    base_uint<BITS> a(*this);
    for (int i = 0; i < WIDTH; i++)
        pn[i] = 0;
    int k = shift / 32;
    shift = shift % 32;
    for (int i = 0; i < WIDTH; i++) {
        if (i - k - 1 >= 0 && shift != 0)
            pn[i - k - 1] |= (a.pn[i] << (32 - shift));
        if (i - k >= 0)
            pn[i - k] |= (a.pn[i] >> shift);
    }
    return *this;
}